

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFace * __thiscall ON_SubD::FaceFromId(ON_SubD *this,uint face_id)

{
  ON_SubDimple *this_00;
  ON_SubDimple *subdimple;
  uint face_id_local;
  ON_SubD *this_local;
  
  if (((face_id == 0) || (face_id == 0xffffffff)) ||
     (this_00 = SubDimple(this), this_00 == (ON_SubDimple *)0x0)) {
    this_local = (ON_SubD *)0x0;
  }
  else {
    this_local = (ON_SubD *)ON_SubDimple::FaceFromId(this_00,face_id);
  }
  return (ON_SubDFace *)this_local;
}

Assistant:

const class ON_SubDFace* ON_SubD::FaceFromId(
  unsigned int face_id
  ) const
{
  for (;;)
  {
    if (0 == face_id || ON_UNSET_UINT_INDEX == face_id )
      break;
    const ON_SubDimple* subdimple = SubDimple();
    if (nullptr == subdimple)
      break;
    return subdimple->FaceFromId(face_id);
  }
  return nullptr;
}